

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

char * __thiscall
XPMP2::SoundSystem::EnumerateSounds(SoundSystem *this,char *prevName,char **ppFilePath)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
  *this_00;
  iterator iVar2;
  undefined8 uVar3;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  iterator sndIter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
  *in_stack_ffffffffffffff48;
  int iVar4;
  _Self local_88;
  allocator<char> *in_stack_ffffffffffffff80;
  _Self in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_59;
  string local_58 [32];
  _Base_ptr local_38;
  _Base_ptr local_30;
  _Self local_28;
  undefined8 *local_20;
  char *local_18;
  char *local_8;
  
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = 0;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
                   *)0x367c74);
  if (bVar1) {
    local_8 = (char *)0x0;
  }
  else {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
         ::end(in_stack_ffffffffffffff48);
    if ((local_18 == (char *)0x0) || (*local_18 == '\0')) {
      local_30 = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
                 ::begin(in_stack_ffffffffffffff48);
      local_28._M_node = local_30;
    }
    else {
      this_00 = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
                 *)(in_RDI + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88._M_node,
                 in_stack_ffffffffffffff80);
      iVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
              ::find(in_stack_ffffffffffffff48,(key_type *)0x367d33);
      local_38 = iVar2._M_node;
      local_28._M_node = iVar2._M_node;
      std::__cxx11::string::~string(local_58);
      iVar4 = (int)((ulong)iVar2._M_node >> 0x20);
      std::allocator<char>::~allocator(&local_59);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
      ::end(in_stack_ffffffffffffff48);
      bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffff88);
      if (bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
        ::operator++(this_00,iVar4);
      }
    }
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar1 = std::operator==(&local_28,&local_88);
    if (bVar1) {
      local_8 = (char *)0x0;
    }
    else {
      if (local_20 != (undefined8 *)0x0) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
                      *)0x367e36);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *)
                           0x367e42);
        if (bVar1) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
                        *)0x367e55);
          std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>::operator->
                    ((unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_> *)
                     0x367e61);
          uVar3 = std::__cxx11::string::c_str();
          *local_20 = uVar3;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>
                    *)0x367e88);
      local_8 = (char *)std::__cxx11::string::c_str();
    }
  }
  return local_8;
}

Assistant:

const char* SoundSystem::EnumerateSounds (const char* prevName, const char** ppFilePath)
{
    if (ppFilePath) *ppFilePath = nullptr;

    // No sounds available at all?
    if (mapSounds.empty())
        return nullptr;
    
    auto sndIter = mapSounds.end();
    // Return first sound?
    if (!prevName || !prevName[0])
        sndIter = mapSounds.begin();
    else {
        // Try finding the given `prevName` sound, then return next
        sndIter = mapSounds.find(prevName);
        if (sndIter != mapSounds.end())
            sndIter++;
    }
    
    // Not found anything anymore?
    if (sndIter == mapSounds.end()) {
        return nullptr;
    } else {
        // Return the found element
        if (ppFilePath && sndIter->second)
            *ppFilePath = sndIter->second->filePath.c_str();
        return sndIter->first.c_str();
    }
}